

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

int reg2bins(int64_t beg,int64_t end,hts_itr_t *itr,int min_shift,int n_lvls)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_4c;
  int i;
  int n;
  int e;
  int b;
  int s;
  int t;
  int l;
  int n_lvls_local;
  int min_shift_local;
  hts_itr_t *itr_local;
  int64_t end_local;
  int64_t beg_local;
  
  e = min_shift + n_lvls * 3;
  if (beg < end) {
    itr_local = (hts_itr_t *)end;
    if (1L << ((byte)e & 0x3f) <= end) {
      itr_local = (hts_itr_t *)(1L << ((byte)e & 0x3f));
    }
    b = 0;
    for (s = 0; s <= n_lvls; s = s + 1) {
      local_4c = b + (int)(beg >> ((byte)e & 0x3f));
      iVar1 = b + (int)((long)((long)&itr_local[-1].bins.a + 7) >> ((byte)e & 0x3f));
      iVar2 = (iVar1 - local_4c) + 1;
      if ((itr->bins).m < (itr->bins).n + iVar2) {
        (itr->bins).m = (itr->bins).n + iVar2;
        (itr->bins).m = (itr->bins).m + -1;
        (itr->bins).m = (itr->bins).m >> 1 | (itr->bins).m;
        (itr->bins).m = (itr->bins).m >> 2 | (itr->bins).m;
        (itr->bins).m = (itr->bins).m >> 4 | (itr->bins).m;
        (itr->bins).m = (itr->bins).m >> 8 | (itr->bins).m;
        (itr->bins).m = (itr->bins).m >> 0x10 | (itr->bins).m;
        (itr->bins).m = (itr->bins).m + 1;
        piVar3 = (int *)realloc((itr->bins).a,(long)(itr->bins).m << 2);
        (itr->bins).a = piVar3;
      }
      for (; local_4c <= iVar1; local_4c = local_4c + 1) {
        iVar2 = (itr->bins).n;
        (itr->bins).n = iVar2 + 1;
        (itr->bins).a[iVar2] = local_4c;
      }
      e = e + -3;
      b = (1 << ((char)(s << 1) + (char)s & 0x1fU)) + b;
    }
    beg_local._4_4_ = (itr->bins).n;
  }
  else {
    beg_local._4_4_ = 0;
  }
  return beg_local._4_4_;
}

Assistant:

static inline int reg2bins(int64_t beg, int64_t end, hts_itr_t *itr, int min_shift, int n_lvls)
{
    int l, t, s = min_shift + (n_lvls<<1) + n_lvls;
    if (beg >= end) return 0;
    if (end >= 1LL<<s) end = 1LL<<s;
    for (--end, l = 0, t = 0; l <= n_lvls; s -= 3, t += 1<<((l<<1)+l), ++l) {
        int b, e, n, i;
        b = t + (beg>>s); e = t + (end>>s); n = e - b + 1;
        if (itr->bins.n + n > itr->bins.m) {
            itr->bins.m = itr->bins.n + n;
            kroundup32(itr->bins.m);
            itr->bins.a = (int*)realloc(itr->bins.a, sizeof(int) * itr->bins.m);
        }
        for (i = b; i <= e; ++i) itr->bins.a[itr->bins.n++] = i;
    }
    return itr->bins.n;
}